

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O1

void __thiscall NaDynAr<NaLinearUnit>::item::~item(item *this)

{
  if (this->pData == (NaLinearUnit *)0x0) {
    NaPrintLog("data=0x%08p removed twice\n",0);
  }
  if (this->pData != (NaLinearUnit *)0x0) {
    (*(this->pData->super_NaUnit).super_NaLogging._vptr_NaLogging[2])();
  }
  this->pData = (NaLinearUnit *)0x0;
  return;
}

Assistant:

~item () {
      if(NULL == pData)
	NaPrintLog("data=0x%08p removed twice\n", pData);
      delete pData;
      pData = NULL;
    }